

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O3

Metadata * PolledFile::Impl::readFileMetadata(Metadata *__return_storage_ptr__,char *filename)

{
  int iVar1;
  uint *puVar2;
  stat st;
  stat local_a0;
  
  iVar1 = stat(filename,&local_a0);
  __return_storage_ptr__->size = 0;
  (__return_storage_ptr__->time).tv_sec = 0;
  (__return_storage_ptr__->time).tv_nsec = 0;
  if (iVar1 == 0) {
    __return_storage_ptr__->size = local_a0.st_size;
    (__return_storage_ptr__->time).tv_sec = local_a0.st_mtim.tv_sec;
    (__return_storage_ptr__->time).tv_nsec = local_a0.st_mtim.tv_nsec;
  }
  else {
    puVar2 = (uint *)__errno_location();
    aAppDebugPrintf("Cannot read %s stat: errno=%d",filename,(ulong)*puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static Metadata readFileMetadata(const char *filename) {
#ifdef _WIN32
		Metadata metadata;
		const HANDLE fh = CreateFileA(filename, GENERIC_READ, FILE_SHARE_READ, NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
		if (fh == INVALID_HANDLE_VALUE) {
			MSG("Cannot check file '%s' modification time: %x", filename, GetLastError());
			return metadata;
		}

		LARGE_INTEGER splurge_integer;
		if (!GetFileSizeEx(fh, &splurge_integer) || splurge_integer.QuadPart > 1024 * 1024) {
			MSG("Cannot get file '%s' size or size is too large", filename);
			goto exit;
		}

		FILETIME ft;
		if (!GetFileTime(fh, NULL, NULL, &ft)) {
			MSG("Cannot get file '%s' modification time", filename);
			goto exit;
		}

		metadata.size = splurge_integer.QuadPart;
		metadata.time = ft;

	exit:
		CloseHandle(fh);
		return metadata;
#else
		struct stat st;
		const int result = stat(filename, &st);
		Metadata metadata;
		if (result == 0) {
			metadata.size = st.st_size;
			metadata.time = st.st_mtim;
		} else
			MSG("Cannot read %s stat: errno=%d", filename, errno);
		return metadata;
#endif
	}